

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_avx2.c
# Opt level: O0

void cfl_predict_lbd_avx2
               (int16_t *pred_buf_q3,uint8_t *dst,int dst_stride,int alpha_q3,int width,int height)

{
  undefined1 auVar1 [32];
  __m256i dc_q0_00;
  __m256i dc_q0_01;
  __m256i alpha_sign_00;
  __m256i alpha_sign_01;
  __m256i alpha_q12_00;
  __m256i alpha_q12_01;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  ushort uVar4;
  ulong uVar5;
  ushort in_CX;
  int in_EDX;
  byte *in_RSI;
  ulong in_RDI;
  int in_R9D;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  longlong lVar11;
  longlong lVar12;
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  __m256i next;
  __m256i res;
  __m256i *row_end;
  __m256i *row;
  __m256i dc_q0;
  __m256i alpha_q12;
  __m256i alpha_sign;
  undefined8 local_260;
  undefined8 uStackY_258;
  undefined8 uStackY_250;
  undefined8 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdc0 [16];
  undefined8 uVar16;
  undefined8 uVar17;
  longlong lVar18;
  undefined8 uStack_1e8;
  byte *local_1b0;
  __m256i *palStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  
  auVar13 = vpinsrw_avx(ZEXT216(in_CX),(uint)in_CX,1);
  auVar13 = vpinsrw_avx(auVar13,(uint)in_CX,2);
  auVar13 = vpinsrw_avx(auVar13,(uint)in_CX,3);
  auVar13 = vpinsrw_avx(auVar13,(uint)in_CX,4);
  auVar13 = vpinsrw_avx(auVar13,(uint)in_CX,5);
  auVar13 = vpinsrw_avx(auVar13,(uint)in_CX,6);
  auVar13 = vpinsrw_avx(auVar13,(uint)in_CX,7);
  auVar8 = vpinsrw_avx(ZEXT216(in_CX),(uint)in_CX,1);
  auVar8 = vpinsrw_avx(auVar8,(uint)in_CX,2);
  auVar8 = vpinsrw_avx(auVar8,(uint)in_CX,3);
  auVar8 = vpinsrw_avx(auVar8,(uint)in_CX,4);
  auVar8 = vpinsrw_avx(auVar8,(uint)in_CX,5);
  auVar8 = vpinsrw_avx(auVar8,(uint)in_CX,6);
  auVar8 = vpinsrw_avx(auVar8,(uint)in_CX,7);
  palStack_b8 = auVar13._8_8_;
  uStack_b0 = auVar8._0_8_;
  uStack_a8 = auVar8._8_8_;
  auVar1._16_8_ = uStack_b0;
  auVar1._0_16_ = auVar13;
  auVar1._24_8_ = uStack_a8;
  auVar1 = vpabsw_avx2(auVar1);
  auVar1 = vpsllw_avx2(auVar1,ZEXT416(9));
  uStack_1e8 = auVar1._24_8_;
  uVar4 = (ushort)*in_RSI;
  auVar13 = vpinsrw_avx(ZEXT216(uVar4),(uint)uVar4,1);
  auVar13 = vpinsrw_avx(auVar13,(uint)uVar4,2);
  auVar13 = vpinsrw_avx(auVar13,(uint)uVar4,3);
  auVar13 = vpinsrw_avx(auVar13,(uint)uVar4,4);
  auVar13 = vpinsrw_avx(auVar13,(uint)uVar4,5);
  auVar13 = vpinsrw_avx(auVar13,(uint)uVar4,6);
  auVar13 = vpinsrw_avx(auVar13,(uint)uVar4,7);
  auVar8 = vpinsrw_avx(ZEXT216(uVar4),(uint)uVar4,1);
  auVar8 = vpinsrw_avx(auVar8,(uint)uVar4,2);
  auVar8 = vpinsrw_avx(auVar8,(uint)uVar4,3);
  auVar8 = vpinsrw_avx(auVar8,(uint)uVar4,4);
  auVar8 = vpinsrw_avx(auVar8,(uint)uVar4,5);
  auVar8 = vpinsrw_avx(auVar8,(uint)uVar4,6);
  auVar8 = vpinsrw_avx(auVar8,(uint)uVar4,7);
  auVar8 = ZEXT116(0) * auVar13 + ZEXT116(1) * auVar8;
  auVar13 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar13;
  uVar5 = in_RDI + (long)(in_R9D << 1) * 0x20;
  uVar6 = auVar1._0_8_;
  uVar9 = auVar1._8_8_;
  lVar11 = auVar1._16_8_;
  local_1b0 = in_RSI;
  do {
    alpha_q12_00[1] = uVar6;
    alpha_q12_00[0] = auVar13._8_8_;
    alpha_q12_00[2] = uVar9;
    alpha_q12_00[3] = lVar11;
    alpha_sign_00[1] = auVar8._0_8_;
    alpha_sign_00[0] = in_RDI;
    alpha_sign_00[2] = auVar8._8_8_;
    alpha_sign_00[3] = auVar13._0_8_;
    dc_q0_00[1] = in_stack_fffffffffffffdc0._0_8_;
    dc_q0_00[2] = in_stack_fffffffffffffdc0._8_8_;
    dc_q0_00[0] = in_stack_fffffffffffffdb8;
    dc_q0_00[3] = uVar5;
    uVar14 = uStack_1e8;
    uVar7 = uVar6;
    uVar10 = uVar9;
    lVar12 = lVar11;
    predict_unclipped(palStack_b8,alpha_q12_00,alpha_sign_00,dc_q0_00);
    alpha_q12_01[1] = uVar7;
    alpha_q12_01[0] = auVar13._8_8_;
    alpha_q12_01[2] = uVar10;
    alpha_q12_01[3] = lVar12;
    alpha_sign_01[1] = auVar8._0_8_;
    alpha_sign_01[0] = in_RDI;
    alpha_sign_01[2] = auVar8._8_8_;
    alpha_sign_01[3] = auVar13._0_8_;
    dc_q0_01[1] = in_stack_fffffffffffffdc0._0_8_;
    dc_q0_01[2] = in_stack_fffffffffffffdc0._8_8_;
    dc_q0_01[0] = uVar14;
    dc_q0_01[3] = uVar5;
    uVar15 = uStack_1e8;
    uVar16 = uVar7;
    uVar17 = uVar10;
    lVar18 = lVar12;
    predict_unclipped(palStack_b8,alpha_q12_01,alpha_sign_01,dc_q0_01);
    auVar3._8_8_ = uVar9;
    auVar3._0_8_ = uVar6;
    auVar3._16_8_ = lVar11;
    auVar3._24_8_ = uVar14;
    auVar2._8_8_ = uVar10;
    auVar2._0_8_ = uVar7;
    auVar2._16_8_ = lVar12;
    auVar2._24_8_ = uVar15;
    auVar1 = vpackuswb_avx2(auVar3,auVar2);
    auVar1 = vpermq_avx2(auVar1,0xd8);
    local_260 = auVar1._0_8_;
    uStackY_258 = auVar1._8_8_;
    uStackY_250 = auVar1._16_8_;
    in_stack_fffffffffffffdb8 = auVar1._24_8_;
    *(undefined8 *)local_1b0 = local_260;
    *(undefined8 *)(local_1b0 + 8) = uStackY_258;
    *(undefined8 *)(local_1b0 + 0x10) = uStackY_250;
    *(undefined8 *)(local_1b0 + 0x18) = in_stack_fffffffffffffdb8;
    local_1b0 = local_1b0 + in_EDX;
    in_RDI = in_RDI + 0x40;
    uVar6 = uVar16;
    uVar9 = uVar17;
    lVar11 = lVar18;
  } while (in_RDI < uVar5);
  return;
}

Assistant:

static inline void cfl_predict_lbd_avx2(const int16_t *pred_buf_q3,
                                        uint8_t *dst, int dst_stride,
                                        int alpha_q3, int width, int height) {
  (void)width;
  const __m256i alpha_sign = _mm256_set1_epi16(alpha_q3);
  const __m256i alpha_q12 = _mm256_slli_epi16(_mm256_abs_epi16(alpha_sign), 9);
  const __m256i dc_q0 = _mm256_set1_epi16(*dst);
  __m256i *row = (__m256i *)pred_buf_q3;
  const __m256i *row_end = row + height * CFL_BUF_LINE_I256;

  do {
    __m256i res = predict_unclipped(row, alpha_q12, alpha_sign, dc_q0);
    __m256i next = predict_unclipped(row + 1, alpha_q12, alpha_sign, dc_q0);
    res = _mm256_packus_epi16(res, next);
    res = _mm256_permute4x64_epi64(res, _MM_SHUFFLE(3, 1, 2, 0));
    _mm256_storeu_si256((__m256i *)dst, res);
    dst += dst_stride;
  } while ((row += CFL_BUF_LINE_I256) < row_end);
}